

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O3

void __thiscall tf::Executor::_process_exception(Executor *this,Worker *param_1,Node *node)

{
  Node **ppNVar1;
  uint uVar2;
  Topology *pTVar3;
  uint uVar4;
  uint uVar5;
  void *__tmp;
  void *pvVar6;
  Node *pNVar7;
  bool bVar8;
  void *local_20;
  
  pNVar7 = node;
  if (node != (Node *)0x0) {
    do {
      uVar5 = (pNVar7->_estate).super___atomic_base<int>._M_i;
      uVar4 = (pNVar7->_estate).super___atomic_base<int>._M_i;
      do {
        LOCK();
        uVar2 = (pNVar7->_estate).super___atomic_base<int>._M_i;
        bVar8 = uVar4 == uVar2;
        if (bVar8) {
          (pNVar7->_estate).super___atomic_base<int>._M_i = uVar4 | 0x30000000;
          uVar2 = uVar4;
        }
        uVar4 = uVar2;
        UNLOCK();
      } while (!bVar8);
      if ((uVar5 >> 0x1e & 1) != 0) {
        if ((uVar4 >> 0x1c & 1) != 0) goto LAB_0010af0c;
        std::current_exception();
        pvVar6 = (pNVar7->_exception_ptr)._M_exception_object;
        (pNVar7->_exception_ptr)._M_exception_object = local_20;
        goto LAB_0010af36;
      }
      ppNVar1 = &pNVar7->_parent;
      pNVar7 = *ppNVar1;
    } while (*ppNVar1 != (Node *)0x0);
  }
  pTVar3 = node->_topology;
  if (pTVar3 != (Topology *)0x0) {
    uVar5 = (pTVar3->_estate).super___atomic_base<int>._M_i;
    do {
      LOCK();
      uVar4 = (pTVar3->_estate).super___atomic_base<int>._M_i;
      bVar8 = uVar5 == uVar4;
      if (bVar8) {
        (pTVar3->_estate).super___atomic_base<int>._M_i = uVar5 | 0x30000000;
        uVar4 = uVar5;
      }
      uVar5 = uVar4;
      UNLOCK();
    } while (!bVar8);
    if ((uVar5 >> 0x1c & 1) == 0) {
      std::current_exception();
      pvVar6 = (pTVar3->_exception_ptr)._M_exception_object;
      (pTVar3->_exception_ptr)._M_exception_object = local_20;
      goto LAB_0010af36;
    }
  }
LAB_0010af0c:
  std::current_exception();
  pvVar6 = (node->_exception_ptr)._M_exception_object;
  (node->_exception_ptr)._M_exception_object = local_20;
LAB_0010af36:
  if (pvVar6 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  return;
}

Assistant:

inline void Executor::_process_exception(Worker&, Node* node) {

  constexpr static auto flag = ESTATE::EXCEPTION | ESTATE::CANCELLED;

  // find the anchor and mark the entire path with exception so recursive
  // or nested tasks can be cancelled properly
  // since exception can come from asynchronous task (with runtime), the node
  // itself can be anchored
  auto anchor = node;
  while(anchor && (anchor->_estate.load(std::memory_order_relaxed) & ESTATE::ANCHORED) == 0) {
    anchor->_estate.fetch_or(flag, std::memory_order_relaxed);
    anchor = anchor->_parent;
  }

  // the exception occurs under a blocking call (e.g., corun, join)
  if(anchor) {
    // multiple tasks may throw, and we only take the first thrown exception
    if((anchor->_estate.fetch_or(flag, std::memory_order_relaxed) & ESTATE::EXCEPTION) == 0) {
      anchor->_exception_ptr = std::current_exception();
      return;
    }
  }
  // otherwise, we simply store the exception in the topology and cancel it
  else if(auto tpg = node->_topology; tpg) {
    // multiple tasks may throw, and we only take the first thrown exception
    if((tpg->_estate.fetch_or(flag, std::memory_order_relaxed) & ESTATE::EXCEPTION) == 0) {
      tpg->_exception_ptr = std::current_exception();
      return;
    }
  }
  
  // for now, we simply store the exception in this node; this can happen in an 
  // execution that does not have any external control to capture the exception,
  // such as silent async task
  node->_exception_ptr = std::current_exception();
}